

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frobtadsapp.cc
# Opt level: O2

int __thiscall
FrobTadsApplication::runTads
          (FrobTadsApplication *this,char *filename,int vm,int argc,char **argv,char *savedState,
          TadsNetConfig *netconfig)

{
  ulong __n;
  int iVar1;
  size_t pathbuflen;
  _Head_base<0UL,_char_*,_false> __dest;
  __uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true> pathbuf;
  __array finalFilename;
  __array gameDirBuf;
  
  pathbuflen = strlen(filename);
  __n = pathbuflen + 1;
  __dest._M_head_impl = (char *)operator_new__(__n);
  memset(__dest._M_head_impl,0,__n);
  finalFilename._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)__dest._M_head_impl
  ;
  strcpy(__dest._M_head_impl,filename);
  if ((this->options).changeDir == true) {
    pathbuf.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)operator_new__(__n);
    memset((void *)pathbuf.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                   super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                   super__Head_base<0UL,_char_*,_false>._M_head_impl,0,__n);
    *(char *)pathbuf.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl = '\0';
    gameDirBuf._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
         (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
         pathbuf.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
         super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
    os_get_path_name((char *)pathbuf.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                             super__Head_base<0UL,_char_*,_false>._M_head_impl,pathbuflen,filename);
    iVar1 = chdir((char *)pathbuf.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                          super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                          super__Head_base<0UL,_char_*,_false>._M_head_impl);
    if (iVar1 == 0) {
      __dest._M_head_impl =
           os_get_root_name((char *)finalFilename._M_t.
                                    super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                                    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                                    super__Head_base<0UL,_char_*,_false>._M_head_impl);
    }
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&gameDirBuf);
  }
  (**this->_vptr_FrobTadsApplication)(this);
  G_oss_screen_width = (*this->_vptr_FrobTadsApplication[0xb])(this);
  G_oss_screen_height = (*this->_vptr_FrobTadsApplication[10])(this);
  osssbini((this->options).scrollBufSize);
  iVar1 = ossgetcolor(4,5,0,0);
  ossdsp(0,0,iVar1," ");
  (*globalApp->_vptr_FrobTadsApplication[4])();
  iVar1 = ossgetcolor(2,3,0,0);
  ossdsp(0,0,iVar1," ");
  (*globalApp->_vptr_FrobTadsApplication[4])();
  if (vm == 0) {
    iVar1 = fRunTads2(this,__dest._M_head_impl);
  }
  else {
    iVar1 = fRunTads3(this,__dest._M_head_impl,argc,argv,savedState,netconfig);
  }
  os_expause();
  osssbdel();
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&finalFilename);
  return iVar1;
}

Assistant:

int
FrobTadsApplication::runTads( const char* filename, int vm, int argc, const char *const *argv,
                              const char* savedState, class TadsNetConfig* netconfig )
{
    // We might strip the path from the filename later, in case we
    // change the current directory.
    size_t filenameLen = strlen(filename);
    char* finalFilenamePtr;
    const auto finalFilename = std::make_unique<char[]>(filenameLen + 1);
    strcpy(finalFilename.get(), filename);
    finalFilenamePtr = finalFilename.get();

    // We'll try setting the current directory to the game's
    // directory (if the user didn't tell us not to).
    if (this->options.changeDir) {
        const auto gameDirBuf = std::make_unique<char[]>(filenameLen + 1);
        gameDirBuf[0] = '\0'; // Paranoia.
        os_get_path_name(gameDirBuf.get(), filenameLen, filename);
        // Try changing the current directory.
        if (this->changeDirectory(gameDirBuf.get())) {
            // Success.  Since we changed the current
            // directory, we must adapt the filename by
            // stripping it from its path.  For this
            // purpose, we'll just store the position of the
            // filename's first character.
            finalFilenamePtr = os_get_root_name(finalFilename.get());
        }
    }

    // Initialize the screen.
    this->init();

    // The osgen layer uses these global variables to determine the
    // size of the screen; set them to the width and height of our
    // game window.
    G_oss_screen_width = this->width();
    G_oss_screen_height = this->height();

    // Initialize the osgen scrollback buffer.
    osssbini(this->options.scrollBufSize);

    // A kludge to circumvent a curses color problem; display one
    // character in reverse video then one in normal colors.  This
    // avoids the problem where the first block of text is shown in
    // wrong colors.
    int tmpColor = ossgetcolor(OSGEN_COLOR_STATUSLINE, OSGEN_COLOR_STATUSBG, 0, 0);
    ossdsp(0, 0, tmpColor, " ");
    globalApp->flush();
    tmpColor = ossgetcolor(OSGEN_COLOR_TEXT, OSGEN_COLOR_TEXTBG, 0, 0);
    ossdsp(0, 0, tmpColor, " ");
    globalApp->flush();

    // Run the VM.
    int vmRet = vm == 0 ? this->fRunTads2(finalFilenamePtr)
                        : this->fRunTads3(finalFilenamePtr, argc, argv, savedState, netconfig);

    // Pause.
    os_expause();

    // Delete the scrollback buffer.
    osssbdel();

    // Return the VM's exit code.
    return vmRet;
}